

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyGuard.h
# Opt level: O0

void __thiscall Js::PropertyGuard::InvalidateDuringSweep(PropertyGuard *this)

{
  bool bVar1;
  JitPolyEquivalentTypeGuard *this_00;
  PropertyGuard *this_local;
  
  this->wasReincarnated = true;
  this->value = 2;
  bVar1 = IsPoly(this);
  if (bVar1) {
    this_00 = AsPolyTypeCheckGuard(this);
    JitPolyEquivalentTypeGuard::InvalidateDuringSweep(this_00);
  }
  return;
}

Assistant:

inline void PropertyGuard::InvalidateDuringSweep()
{
#if DBG
    wasReincarnated = true;
#endif
    this->value = GuardValue::Invalidated_DuringSweep;
#if ENABLE_NATIVE_CODEGEN
    if (this->IsPoly())
    {
        this->AsPolyTypeCheckGuard()->JitPolyEquivalentTypeGuard::InvalidateDuringSweep();
    }
#endif
}